

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O2

CatalogTransaction * __thiscall
duckdb::CatalogSetSecretStorage::GetTransactionOrDefault
          (CatalogTransaction *__return_storage_ptr__,CatalogSetSecretStorage *this,
          optional_ptr<duckdb::CatalogTransaction,_true> transaction)

{
  ClientContext *pCVar1;
  Transaction *pTVar2;
  transaction_t tVar3;
  CatalogTransaction *pCVar4;
  optional_ptr<duckdb::CatalogTransaction,_true> local_10;
  
  local_10.ptr = transaction.ptr;
  if (transaction.ptr == (CatalogTransaction *)0x0) {
    CatalogTransaction::GetSystemTransaction(__return_storage_ptr__,this->db);
  }
  else {
    pCVar4 = optional_ptr<duckdb::CatalogTransaction,_true>::operator*(&local_10);
    pCVar1 = (pCVar4->context).ptr;
    pTVar2 = (pCVar4->transaction).ptr;
    tVar3 = pCVar4->transaction_id;
    (__return_storage_ptr__->db).ptr = (pCVar4->db).ptr;
    (__return_storage_ptr__->context).ptr = pCVar1;
    (__return_storage_ptr__->transaction).ptr = pTVar2;
    __return_storage_ptr__->transaction_id = tVar3;
    __return_storage_ptr__->start_time = pCVar4->start_time;
  }
  return __return_storage_ptr__;
}

Assistant:

CatalogTransaction CatalogSetSecretStorage::GetTransactionOrDefault(optional_ptr<CatalogTransaction> transaction) {
	if (transaction) {
		return *transaction;
	}
	return CatalogTransaction::GetSystemTransaction(db);
}